

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s_prov.c
# Opt level: O0

void blake2s_init_param(BLAKE2S_CTX *S,BLAKE2S_PARAM *P)

{
  uint32_t uVar1;
  BLAKE2S_CTX *in_RSI;
  long in_RDI;
  uint8_t *p;
  size_t i;
  BLAKE2S_CTX *pBVar2;
  ulong local_18;
  
  pBVar2 = in_RSI;
  blake2s_init0(in_RSI);
  *(ulong *)(in_RDI + 0x78) = (ulong)(byte)in_RSI->h[0];
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    uVar1 = load32((uint8_t *)(pBVar2->h + local_18));
    *(uint32_t *)(in_RDI + local_18 * 4) = uVar1 ^ *(uint *)(in_RDI + local_18 * 4);
  }
  return;
}

Assistant:

static void blake2s_init_param(BLAKE2S_CTX *S, const BLAKE2S_PARAM *P)
{
    size_t i;
    const uint8_t *p = (const uint8_t *)(P);

    blake2s_init0(S);
    S->outlen = P->digest_length;

    /* The param struct is carefully hand packed, and should be 32 bytes on
     * every platform. */
    assert(sizeof(BLAKE2S_PARAM) == 32);
    /* IV XOR ParamBlock */
    for (i = 0; i < 8; ++i) {
        S->h[i] ^= load32(&p[i*4]);
    }
}